

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_mix_2_0_to_3_0(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  undefined8 *puVar3;
  uint32_t i;
  ulong uVar4;
  uint32_t frames;
  float *l;
  float *fc;
  float *fr;
  float *fl;
  float *r;
  
  puVar3 = (undefined8 *)segment->data;
  frames = 0xffffffff;
  mixed_buffer_request_read(&l,&frames,(mixed_buffer *)*puVar3);
  mixed_buffer_request_read(&r,&frames,(mixed_buffer *)puVar3[1]);
  mixed_buffer_request_write(&fl,&frames,(mixed_buffer *)puVar3[0xe]);
  mixed_buffer_request_write(&fr,&frames,(mixed_buffer *)puVar3[0xf]);
  mixed_buffer_request_write(&fc,&frames,(mixed_buffer *)puVar3[0x10]);
  for (uVar4 = 0; frames != uVar4; uVar4 = uVar4 + 1) {
    fVar1 = l[uVar4];
    fVar2 = r[uVar4];
    fl[uVar4] = fVar1;
    fr[uVar4] = fVar2;
    fc[uVar4] = (fVar1 + fVar2) * 0.5;
  }
  mixed_buffer_finish_read(frames,(mixed_buffer *)*puVar3);
  mixed_buffer_finish_read(frames,(mixed_buffer *)puVar3[1]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0xe]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0xf]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar3[0x10]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_3_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  
  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict fc;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&fc, &frames, data->out[2]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];
    float c = (li+ri)*0.5f;

    fl[i] = li;
    fr[i] = ri;
    fc[i] = c;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[2]);

  return 1;
}